

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O0

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_2,_0,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *lhs,Matrix<double,__1,__1,_0,__1,__1> *rhs)

{
  DenseIndex otherSize;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this;
  Index depth;
  Index rows;
  Index cols;
  Scalar *_tri;
  Index triStride;
  Scalar *_other;
  Index otherStride;
  undefined1 local_78 [8];
  BlockingType blocking;
  Index othersize;
  Index size;
  type actualLhs;
  Matrix<double,__1,__1,_0,__1,__1> *rhs_local;
  Matrix<double,__1,__1,_0,__1,__1> *lhs_local;
  
  this = &blas_traits<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::extract(lhs)->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
  depth = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  blocking.m_sizeW =
       PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                 (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  rows = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                   (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  cols = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                   (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::gemm_blocking_space
            ((gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *)local_78,rows,cols,
             depth);
  otherSize = blocking.m_sizeW;
  _tri = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef(this,0,0);
  triStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride
                        ((Matrix<double,__1,__1,_0,__1,__1> *)this);
  _other = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                     (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,0,0);
  otherStride = Matrix<double,_-1,_-1,_0,_-1,_-1>::outerStride(rhs);
  triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0>::run
            (depth,otherSize,_tri,triStride,_other,otherStride,
             (level3_blocking<double,_double> *)local_78);
  gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_4,_false>::~gemm_blocking_space
            ((gemm_blocking_space<0,_double,_double,__1,__1,__1,_4,_false> *)local_78);
  return;
}

Assistant:

static void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.outerStride(), blocking);
  }